

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O0

void editFile(string *path)

{
  char *__command;
  string local_30 [32];
  string *local_10;
  string *path_local;
  
  local_10 = path;
  std::operator+((char *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"vim ");
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void editFile(std::string path) {
    system(("vim " + path).c_str());
}